

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O0

bool __thiscall xray_re::xr_ogf::load_ogf(xr_ogf *this,char *path,string *name)

{
  bool bVar1;
  xr_reader *local_38;
  xr_reader *r;
  xr_file_system *fs;
  string *name_local;
  char *path_local;
  xr_ogf *this_local;
  
  fs = (xr_file_system *)name;
  name_local = (string *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  local_38 = xr_file_system::r_open((xr_file_system *)r,(char *)name_local,(string *)fs);
  bVar1 = local_38 != (xr_reader *)0x0;
  if (bVar1) {
    (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x15])
              (this,local_38);
    xr_file_system::r_close((xr_file_system *)r,&local_38);
  }
  return bVar1;
}

Assistant:

bool xr_ogf::load_ogf(const char* path, const std::string& name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	load_ogf(*r);
	fs.r_close(r);
	return true;
}